

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_bufferPool * ZSTDMT_createBufferPool(uint nbWorkers,ZSTD_customMem cMem)

{
  int iVar1;
  ZSTDMT_bufferPool *bufPool;
  uint maxNbBuffers;
  uint nbWorkers_local;
  
  _maxNbBuffers = (pthread_mutex_t *)ZSTD_calloc((ulong)(nbWorkers * 2 + 2) * 0x10 + 0x60,cMem);
  if (_maxNbBuffers == (pthread_mutex_t *)0x0) {
    _maxNbBuffers = (pthread_mutex_t *)0x0;
  }
  else {
    iVar1 = pthread_mutex_init(_maxNbBuffers,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      _maxNbBuffers[1].__align = 0x10000;
      *(uint *)((long)_maxNbBuffers + 0x30) = nbWorkers * 2 + 3;
      *(undefined4 *)((long)_maxNbBuffers + 0x34) = 0;
      *(ZSTD_allocFunction *)((long)_maxNbBuffers + 0x38) = cMem.customAlloc;
      *(ZSTD_freeFunction *)((long)_maxNbBuffers + 0x40) = cMem.customFree;
      *(void **)((long)_maxNbBuffers + 0x48) = cMem.opaque;
    }
    else {
      ZSTD_free(_maxNbBuffers,cMem);
      _maxNbBuffers = (pthread_mutex_t *)0x0;
    }
  }
  return (ZSTDMT_bufferPool *)_maxNbBuffers;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_createBufferPool(unsigned nbWorkers, ZSTD_customMem cMem)
{
    unsigned const maxNbBuffers = 2*nbWorkers + 3;
    ZSTDMT_bufferPool* const bufPool = (ZSTDMT_bufferPool*)ZSTD_calloc(
        sizeof(ZSTDMT_bufferPool) + (maxNbBuffers-1) * sizeof(buffer_t), cMem);
    if (bufPool==NULL) return NULL;
    if (ZSTD_pthread_mutex_init(&bufPool->poolMutex, NULL)) {
        ZSTD_free(bufPool, cMem);
        return NULL;
    }
    bufPool->bufferSize = 64 KB;
    bufPool->totalBuffers = maxNbBuffers;
    bufPool->nbBuffers = 0;
    bufPool->cMem = cMem;
    return bufPool;
}